

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

programCollectionForFunction * __thiscall
glcts::TextureCubeMapArraySamplingTest::programCollectionForFormat::getPrograms
          (programCollectionForFormat *this,samplingFunction function)

{
  switch(function) {
  case Texture:
    break;
  case TextureLod:
    return &this->m_programs_for_textureLod;
  case TextureGrad:
    return &this->m_programs_for_textureGrad;
  case TextureGather:
    return &this->m_programs_for_textureGather;
  default:
    this = (programCollectionForFormat *)0x0;
  }
  return &this->m_programs_for_texture;
}

Assistant:

const TextureCubeMapArraySamplingTest::programCollectionForFunction* TextureCubeMapArraySamplingTest::
	programCollectionForFormat::getPrograms(samplingFunction function) const
{
	switch (function)
	{
	case Texture:
		return &m_programs_for_texture;
		break;
	case TextureLod:
		return &m_programs_for_textureLod;
		break;
	case TextureGrad:
		return &m_programs_for_textureGrad;
		break;
	case TextureGather:
		return &m_programs_for_textureGather;
		break;
	};

	return 0;
}